

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

char * wabt::anon_unknown_0::CWriter::GetCTypeName(Type *type)

{
  switch((int)type) {
  case -0x11:
    return "wasm_rt_externref_t";
  case -0x10:
    return "wasm_rt_funcref_t";
  case -0xf:
  case -0xe:
  case -0xd:
  case -0xc:
  case -0xb:
  case -10:
  case -9:
  case -8:
  case -7:
  case -6:
    goto switchD_001438d2_caseD_fffffff1;
  case -5:
    return "v128";
  case -4:
    return "f64";
  case -3:
    return "f32";
  case -2:
    return "u64";
  case -1:
    return "u32";
  default:
    if ((int)type == -0x17) {
      return "wasm_rt_exnref_t";
    }
switchD_001438d2_caseD_fffffff1:
    abort();
  }
}

Assistant:

const char* CWriter::GetCTypeName(const Type& type) {
  // clang-format off
  switch (type) {
  case Type::I32: return "u32";
  case Type::I64: return "u64";
  case Type::F32: return "f32";
  case Type::F64: return "f64";
  case Type::V128: return "v128";
  case Type::FuncRef: return "wasm_rt_funcref_t";
  case Type::ExternRef: return "wasm_rt_externref_t";
  case Type::ExnRef: return "wasm_rt_exnref_t";
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on
}